

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

size_t readmoredata(char *buffer,size_t size,size_t nitems,void *userp)

{
  long lVar1;
  size_t __n;
  undefined8 uVar2;
  size_t sVar3;
  size_t __n_00;
  
  lVar1 = *(long *)((long)userp + 0x198);
  if (*(long *)(lVar1 + 8) == 0) {
    __n_00 = 0;
  }
  else {
    sVar3 = nitems * size;
    *(ushort *)((long)userp + 0x1a9) =
         *(ushort *)((long)userp + 0x1a9) & 0xfdff | (ushort)(*(int *)(lVar1 + 0x200) == 1) << 9;
    __n_00 = *(size_t *)((long)userp + 0x300);
    __n = *(size_t *)(lVar1 + 8);
    if ((((long)__n_00 < (long)__n && (long)__n_00 < (long)sVar3) && __n_00 != 0) ||
       (__n_00 = sVar3, (long)sVar3 < (long)__n)) {
      memcpy(buffer,*(void **)(lVar1 + 0x10),__n_00);
      *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + __n_00;
      *(long *)(lVar1 + 8) = *(long *)(lVar1 + 8) - __n_00;
    }
    else {
      memcpy(buffer,*(void **)(lVar1 + 0x10),__n);
      __n_00 = *(size_t *)(lVar1 + 8);
      if (*(long *)(lVar1 + 0x1f8) == 0) {
        *(undefined8 *)(lVar1 + 8) = 0;
      }
      else {
        *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar1 + 0x1f0);
        *(long *)(lVar1 + 8) = *(long *)(lVar1 + 0x1f8);
        uVar2 = *(undefined8 *)(lVar1 + 0x1e8);
        *(undefined8 *)((long)userp + 0x1178) = *(undefined8 *)(lVar1 + 0x1e0);
        *(undefined8 *)((long)userp + 0x1180) = uVar2;
        *(int *)(lVar1 + 0x200) = *(int *)(lVar1 + 0x200) + 1;
        *(undefined8 *)(lVar1 + 0x1f8) = 0;
      }
    }
  }
  return __n_00;
}

Assistant:

static size_t readmoredata(char *buffer,
                           size_t size,
                           size_t nitems,
                           void *userp)
{
  struct Curl_easy *data = (struct Curl_easy *)userp;
  struct HTTP *http = data->req.p.http;
  size_t fullsize = size * nitems;

  if(!http->postsize)
    /* nothing to return */
    return 0;

  /* make sure that a HTTP request is never sent away chunked! */
  data->req.forbidchunk = (http->sending == HTTPSEND_REQUEST)?TRUE:FALSE;

  if(data->set.max_send_speed &&
     (data->set.max_send_speed < (curl_off_t)fullsize) &&
     (data->set.max_send_speed < http->postsize))
    /* speed limit */
    fullsize = (size_t)data->set.max_send_speed;

  else if(http->postsize <= (curl_off_t)fullsize) {
    memcpy(buffer, http->postdata, (size_t)http->postsize);
    fullsize = (size_t)http->postsize;

    if(http->backup.postsize) {
      /* move backup data into focus and continue on that */
      http->postdata = http->backup.postdata;
      http->postsize = http->backup.postsize;
      data->state.fread_func = http->backup.fread_func;
      data->state.in = http->backup.fread_in;

      http->sending++; /* move one step up */

      http->backup.postsize = 0;
    }
    else
      http->postsize = 0;

    return fullsize;
  }

  memcpy(buffer, http->postdata, fullsize);
  http->postdata += fullsize;
  http->postsize -= fullsize;

  return fullsize;
}